

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# servak.cpp
# Opt level: O2

string_view mime_type(string_view path)

{
  size_t sVar1;
  bool bVar2;
  size_type pos;
  char *pcVar3;
  string_view sVar4;
  string_view rhs;
  string_view rhs_00;
  string_view rhs_01;
  string_view rhs_02;
  string_view rhs_03;
  string_view rhs_04;
  string_view rhs_05;
  string_view rhs_06;
  string_view rhs_07;
  string_view rhs_08;
  string_view rhs_09;
  string_view rhs_10;
  string_view rhs_11;
  string_view rhs_12;
  string_view rhs_13;
  string_view rhs_14;
  string_view rhs_15;
  string_view rhs_16;
  string_view rhs_17;
  string_view rhs_18;
  string_view rhs_19;
  size_t sStack_40;
  string_view path_local;
  
  path_local.len_ = path.len_;
  path_local.ptr_ = path.ptr_;
  pos = boost::basic_string_view<char,_std::char_traits<char>_>::rfind
                  (&path_local,".",0xffffffffffffffff);
  if (pos == 0xffffffffffffffff) {
    sVar4 = (string_view)ZEXT816(0);
  }
  else {
    sVar4 = boost::basic_string_view<char,_std::char_traits<char>_>::substr
                      (&path_local,pos,0xffffffffffffffff);
  }
  rhs.len_ = 4;
  rhs.ptr_ = ".htm";
  bVar2 = boost::beast::iequals(sVar4,rhs);
  sVar1 = 9;
  pcVar3 = "text/html";
  sStack_40 = sVar1;
  if (((!bVar2) &&
      (rhs_00.len_ = 5, rhs_00.ptr_ = ".html", bVar2 = boost::beast::iequals(sVar4,rhs_00), !bVar2))
     && (rhs_01.len_ = 4, rhs_01.ptr_ = ".php", bVar2 = boost::beast::iequals(sVar4,rhs_01), !bVar2)
     ) {
    rhs_02.len_ = 4;
    rhs_02.ptr_ = ".css";
    bVar2 = boost::beast::iequals(sVar4,rhs_02);
    if (bVar2) {
      sStack_40 = 8;
      pcVar3 = "text/css";
    }
    else {
      rhs_03.len_ = 4;
      rhs_03.ptr_ = ".txt";
      bVar2 = boost::beast::iequals(sVar4,rhs_03);
      sStack_40 = 10;
      if (bVar2) {
        pcVar3 = "text/plain";
      }
      else {
        rhs_04.len_ = 3;
        rhs_04.ptr_ = ".js";
        bVar2 = boost::beast::iequals(sVar4,rhs_04);
        if (bVar2) {
          pcVar3 = "application/javascript";
          sStack_40 = 0x16;
        }
        else {
          rhs_05.len_ = 5;
          rhs_05.ptr_ = ".json";
          bVar2 = boost::beast::iequals(sVar4,rhs_05);
          if (bVar2) {
            pcVar3 = "application/json";
            sStack_40 = 0x10;
          }
          else {
            rhs_06.len_ = 4;
            rhs_06.ptr_ = ".xml";
            bVar2 = boost::beast::iequals(sVar4,rhs_06);
            if (bVar2) {
              pcVar3 = "application/xml";
              sStack_40 = 0xf;
            }
            else {
              rhs_07.len_ = 4;
              rhs_07.ptr_ = ".swf";
              bVar2 = boost::beast::iequals(sVar4,rhs_07);
              if (bVar2) {
                pcVar3 = "application/x-shockwave-flash";
                sStack_40 = 0x1d;
              }
              else {
                rhs_08.len_ = 4;
                rhs_08.ptr_ = ".flv";
                bVar2 = boost::beast::iequals(sVar4,rhs_08);
                if (bVar2) {
                  pcVar3 = "video/x-flv";
                  sStack_40 = 0xb;
                }
                else {
                  rhs_09.len_ = 4;
                  rhs_09.ptr_ = ".png";
                  bVar2 = boost::beast::iequals(sVar4,rhs_09);
                  if (bVar2) {
                    pcVar3 = "image/png";
                    sStack_40 = sVar1;
                  }
                  else {
                    rhs_10.len_ = 4;
                    rhs_10.ptr_ = ".jpe";
                    bVar2 = boost::beast::iequals(sVar4,rhs_10);
                    pcVar3 = "image/jpeg";
                    if (((!bVar2) &&
                        (rhs_11.len_ = 5, rhs_11.ptr_ = ".jpeg",
                        bVar2 = boost::beast::iequals(sVar4,rhs_11), !bVar2)) &&
                       (rhs_12.len_ = 4, rhs_12.ptr_ = ".jpg",
                       bVar2 = boost::beast::iequals(sVar4,rhs_12), !bVar2)) {
                      rhs_13.len_ = 4;
                      rhs_13.ptr_ = ".gif";
                      bVar2 = boost::beast::iequals(sVar4,rhs_13);
                      if (bVar2) {
                        pcVar3 = "image/gif";
                        sStack_40 = sVar1;
                      }
                      else {
                        rhs_14.len_ = 4;
                        rhs_14.ptr_ = ".bmp";
                        bVar2 = boost::beast::iequals(sVar4,rhs_14);
                        if (bVar2) {
                          pcVar3 = "image/bmp";
                          sStack_40 = sVar1;
                        }
                        else {
                          rhs_15.len_ = 4;
                          rhs_15.ptr_ = ".ico";
                          bVar2 = boost::beast::iequals(sVar4,rhs_15);
                          if (bVar2) {
                            pcVar3 = "image/vnd.microsoft.icon";
                            sStack_40 = 0x18;
                          }
                          else {
                            rhs_16.len_ = 5;
                            rhs_16.ptr_ = ".tiff";
                            bVar2 = boost::beast::iequals(sVar4,rhs_16);
                            pcVar3 = "image/tiff";
                            if ((!bVar2) &&
                               (rhs_17.len_ = 4, rhs_17.ptr_ = ".tif",
                               bVar2 = boost::beast::iequals(sVar4,rhs_17), !bVar2)) {
                              rhs_18.len_ = 4;
                              rhs_18.ptr_ = ".svg";
                              bVar2 = boost::beast::iequals(sVar4,rhs_18);
                              if (bVar2) {
                                pcVar3 = "image/svg+xml";
                                sStack_40 = 0xd;
                              }
                              else {
                                rhs_19.len_ = 5;
                                rhs_19.ptr_ = ".svgz";
                                bVar2 = boost::beast::iequals(sVar4,rhs_19);
                                pcVar3 = "application/text";
                                if (bVar2) {
                                  pcVar3 = "image/svg+xml";
                                }
                                sStack_40 = (ulong)!bVar2 * 3 + 0xd;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  sVar4.len_ = sStack_40;
  sVar4.ptr_ = pcVar3;
  return sVar4;
}

Assistant:

beast::string_view
mime_type(beast::string_view path)
{
    using beast::iequals;
    auto const ext = [&path]
    {
        auto const pos = path.rfind(".");
        if(pos == beast::string_view::npos)
            return beast::string_view{};
        return path.substr(pos);
    }();
    if(iequals(ext, ".htm"))  return "text/html";
    if(iequals(ext, ".html")) return "text/html";
    if(iequals(ext, ".php"))  return "text/html";
    if(iequals(ext, ".css"))  return "text/css";
    if(iequals(ext, ".txt"))  return "text/plain";
    if(iequals(ext, ".js"))   return "application/javascript";
    if(iequals(ext, ".json")) return "application/json";
    if(iequals(ext, ".xml"))  return "application/xml";
    if(iequals(ext, ".swf"))  return "application/x-shockwave-flash";
    if(iequals(ext, ".flv"))  return "video/x-flv";
    if(iequals(ext, ".png"))  return "image/png";
    if(iequals(ext, ".jpe"))  return "image/jpeg";
    if(iequals(ext, ".jpeg")) return "image/jpeg";
    if(iequals(ext, ".jpg"))  return "image/jpeg";
    if(iequals(ext, ".gif"))  return "image/gif";
    if(iequals(ext, ".bmp"))  return "image/bmp";
    if(iequals(ext, ".ico"))  return "image/vnd.microsoft.icon";
    if(iequals(ext, ".tiff")) return "image/tiff";
    if(iequals(ext, ".tif"))  return "image/tiff";
    if(iequals(ext, ".svg"))  return "image/svg+xml";
    if(iequals(ext, ".svgz")) return "image/svg+xml";
    return "application/text";
}